

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O1

void __thiscall ModbusAnalyzer::ModbusAnalyzer(ModbusAnalyzer *this)

{
  ulong uVar1;
  int i;
  ModbusAnalyzerSettings *this_00;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__ModbusAnalyzer_00121ca0;
  this_00 = (ModbusAnalyzerSettings *)operator_new(0x78);
  ModbusAnalyzerSettings::ModbusAnalyzerSettings(this_00);
  (this->mSettings)._M_ptr = this_00;
  (this->mResults)._M_ptr = (ModbusAnalyzerResults *)0x0;
  ModbusSimulationDataGenerator::ModbusSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  uVar2 = 0;
  do {
    iVar3 = 8;
    uVar5 = 0;
    uVar6 = uVar2 & 0xffffffff;
    do {
      uVar4 = (uint)uVar5;
      uVar1 = (uVar5 & 0xffff) >> 1;
      uVar5 = (ulong)((uint)uVar1 ^ 0xffffa001);
      if (((uVar4 ^ (uint)uVar6) & 1) == 0) {
        uVar5 = uVar1;
      }
      uVar6 = (ulong)((uint)uVar6 >> 1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    this->crc_tab16[uVar2] = (U16)uVar5;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x100);
  return;
}

Assistant:

ModbusAnalyzer::ModbusAnalyzer() : Analyzer2(), mSettings( new ModbusAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );

    // used for calculating Modbus Checksum values
    init_crc16_tab();
}